

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O0

container<unsigned_char> __thiscall pstore::repo::generic_section::payload(generic_section *this)

{
  uchar *begin_00;
  uchar *begin;
  generic_section *this_local;
  
  begin_00 = aligned_ptr<unsigned_char,pstore::repo::generic_section>(this + 1);
  container<unsigned_char>::container
            ((container<unsigned_char> *)&this_local,begin_00,begin_00 + this->data_size_);
  return _this_local;
}

Assistant:

container<std::uint8_t> payload () const noexcept {
                auto const * const begin = aligned_ptr<std::uint8_t> (this + 1);
                return {begin, begin + data_size_};
            }